

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

void invokeCallbacksPRE(poptContext con,poptOption *opt)

{
  uint uVar1;
  bool bVar2;
  poptOption *local_20;
  poptArg arg;
  poptOption *opt_local;
  poptContext con_local;
  
  arg = (poptArg)opt;
  if (opt != (poptOption *)0x0) {
    while( true ) {
      bVar2 = true;
      if ((*arg.longp == 0) && (bVar2 = true, (arg.opt)->shortName == '\0')) {
        bVar2 = (arg.opt)->arg != (void *)0x0;
      }
      if (!bVar2) break;
      local_20 = *(poptOption **)(arg.cb + 0x10);
      if (local_20 != (poptOption *)0x0) {
        uVar1 = (arg.opt)->argInfo & _poptArgMask;
        if (uVar1 == 4) {
          if (local_20 == poptHelpOptions) {
            local_20 = poptHelpOptionsI18N;
          }
          invokeCallbacksPRE(con,local_20);
        }
        else if ((uVar1 == 5) && (((arg.opt)->argInfo & 0x80000000) != 0)) {
          (*(code *)local_20)(con,0,0,0,(arg.opt)->descrip);
        }
      }
      arg.ptr = arg.cb + 0x30;
    }
  }
  return;
}

Assistant:

static void invokeCallbacksPRE(poptContext con, const struct poptOption * opt)
{
    if (opt != NULL)
    for (; opt->longName || opt->shortName || opt->arg; opt++) {
	poptArg arg = { .ptr = opt->arg };
	if (arg.ptr)
	switch (poptArgType(opt)) {
	case POPT_ARG_INCLUDE_TABLE:	/* Recurse on included sub-tables. */
	    poptSubstituteHelpI18N(arg.opt);	/* XXX side effects */
	    invokeCallbacksPRE(con, arg.opt);
	    break;
	case POPT_ARG_CALLBACK:		/* Perform callback. */
	    if (!CBF_ISSET(opt, PRE))
		break;
	    arg.cb(con, POPT_CALLBACK_REASON_PRE, NULL, NULL, opt->descrip);
	    break;
	}
    }
}